

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void gguf_write_to_buf(gguf_context *ctx,vector<signed_char,_std::allocator<signed_char>_> *buf,
                      bool only_meta)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int64_t i;
  long lVar3;
  int64_t i_2;
  int iVar4;
  long lVar5;
  gguf_writer gw;
  int64_t n_tensors;
  int64_t n_kv;
  
  n_kv = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x58;
  __n = 0x158;
  n_tensors = ((long)(ctx->info).
                     super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(ctx->info).
                    super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x158;
  gw.buf = buf;
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back(buf,"GGUF");
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back(buf,"GUF");
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back(buf,"UF");
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back(buf,"F");
  gguf_writer::write<unsigned_int>(&gw,&ctx->version);
  gguf_writer::write<long>(&gw,&n_tensors);
  gguf_writer::write<long>(&gw,&n_kv);
  iVar4 = 0;
  __buf = extraout_RDX;
  for (lVar3 = 0; lVar3 < n_kv; lVar3 = lVar3 + 1) {
    gguf_writer::write(&gw,(int)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>.
                                _M_impl.super__Vector_impl_data._M_start + iVar4,__buf,__n);
    iVar4 = iVar4 + 0x58;
    __buf = extraout_RDX_00;
  }
  lVar5 = 0;
  for (lVar3 = 0; lVar3 < n_tensors; lVar3 = lVar3 + 1) {
    gguf_writer::write_tensor_meta
              (&gw,(gguf_tensor_info *)
                   ((long)(((ctx->info).
                            super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                            _M_impl.super__Vector_impl_data._M_start)->t).ne + lVar5 + -0x10));
    lVar5 = lVar5 + 0x158;
  }
  gguf_writer::pad(&gw,ctx->alignment);
  if (!only_meta) {
    pcVar1 = ((gw.buf)->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar2 = ((gw.buf)->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    for (lVar5 = 0; lVar5 < n_tensors; lVar5 = lVar5 + 1) {
      gguf_writer::write_tensor_data
                (&gw,(gguf_tensor_info *)
                     ((long)(((ctx->info).
                              super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                              ._M_impl.super__Vector_impl_data._M_start)->t).ne + lVar3 + -0x10),
                 (long)pcVar1 - (long)pcVar2,ctx->alignment);
      lVar3 = lVar3 + 0x158;
    }
  }
  return;
}

Assistant:

void gguf_write_to_buf(const struct gguf_context * ctx, std::vector<int8_t> & buf, bool only_meta) {
    const struct gguf_writer gw(buf);

    const int64_t n_kv      = gguf_get_n_kv(ctx);
    const int64_t n_tensors = gguf_get_n_tensors(ctx);

    // write header
    gw.write(GGUF_MAGIC[0]);
    gw.write(GGUF_MAGIC[1]);
    gw.write(GGUF_MAGIC[2]);
    gw.write(GGUF_MAGIC[3]);
    gw.write(ctx->version);
    gw.write(n_tensors);
    gw.write(n_kv);

    // write key-value pairs
    for (int64_t i = 0; i < n_kv; ++i) {
        gw.write(ctx->kv[i]);
    }

    // write tensor info
    for (int64_t i = 0; i < n_tensors; ++i) {
        gw.write_tensor_meta(ctx->info[i]);
    }

    // we require the data section to be aligned
    gw.pad(ctx->alignment);

    if (only_meta) {
        return;
    }

    const size_t offset_data = gw.buf.size();

    // write tensor data
    for (int64_t i = 0; i < n_tensors; ++i) {
        gw.write_tensor_data(ctx->info[i], offset_data, ctx->alignment);
    }
}